

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_body(Curl_easy *data,connectdata *conn,Curl_HttpReq httpreq,char **tep)

{
  HTTP *pHVar1;
  _Bool _Var2;
  CURLcode CVar3;
  curl_mimepart *pcVar4;
  curl_off_t cVar5;
  char *headerline;
  char *local_50;
  char *cthdr;
  HTTP *http;
  char *ptr;
  CURLcode result;
  char **tep_local;
  Curl_HttpReq httpreq_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pHVar1 = (data->req).p.http;
  pHVar1->postsize = 0;
  if (httpreq == HTTPREQ_POST_FORM) {
    if ((data->state).formp == (curl_mimepart *)0x0) {
      pcVar4 = (curl_mimepart *)(*Curl_ccalloc)(1,0x1b8);
      (data->state).formp = pcVar4;
      if ((data->state).formp == (curl_mimepart *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      Curl_mime_cleanpart((data->state).formp);
      CVar3 = Curl_getformdata(data,(data->state).formp,(data->set).httppost,
                               (data->state).fread_func);
      if (CVar3 != CURLE_OK) {
        (*Curl_cfree)((data->state).formp);
        (data->state).formp = (curl_mimepart *)0x0;
        return CVar3;
      }
      (data->state).mimepost = (data->state).formp;
    }
  }
  else if (httpreq == HTTPREQ_POST_MIME) {
    (data->state).mimepost = &(data->set).mimepost;
  }
  else {
    (data->state).mimepost = (curl_mimepart *)0x0;
  }
  ptr._4_4_ = CURLE_OK;
  if ((data->state).mimepost != (curl_mimepart *)0x0) {
    local_50 = Curl_checkheaders(data,"Content-Type",0xc);
    pcVar4 = (data->state).mimepost;
    pcVar4->flags = pcVar4->flags | 2;
    if (local_50 == (char *)0x0) {
      local_50 = (char *)0x0;
      if (((data->state).mimepost)->kind == MIMEKIND_MULTIPART) {
        local_50 = "multipart/form-data";
      }
    }
    else {
      for (local_50 = local_50 + 0xd; *local_50 == ' '; local_50 = local_50 + 1) {
      }
    }
    curl_mime_headers((data->state).mimepost,(data->set).headers,0);
    ptr._4_4_ = Curl_mime_prepare_headers
                          (data,(data->state).mimepost,local_50,(char *)0x0,MIMESTRATEGY_FORM);
    curl_mime_headers((data->state).mimepost,(curl_slist *)0x0,0);
    if (ptr._4_4_ == CURLE_OK) {
      ptr._4_4_ = Curl_mime_rewind((data->state).mimepost);
    }
    if (ptr._4_4_ != CURLE_OK) {
      return ptr._4_4_;
    }
    cVar5 = Curl_mime_size((data->state).mimepost);
    pHVar1->postsize = cVar5;
  }
  headerline = Curl_checkheaders(data,"Transfer-Encoding",0x11);
  if (headerline == (char *)0x0) {
    if (((conn->handler->protocol & 3) == 0) ||
       ((((httpreq != HTTPREQ_POST_MIME && (httpreq != HTTPREQ_POST_FORM)) ||
         (-1 < pHVar1->postsize)) &&
        ((((*(uint *)&(data->state).field_0x74c >> 0x14 & 1) == 0 && (httpreq != HTTPREQ_POST)) ||
         ((data->state).infilesize != -1)))))) {
      *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xfdff;
    }
    else if (((uint)conn->bits >> 0x10 & 1) == 0) {
      _Var2 = Curl_use_http_1_1plus(data,conn);
      if (!_Var2) {
        Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
      if (conn->httpversion < 0x14) {
        *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xfdff | 0x200;
      }
    }
    if ((*(ushort *)&(data->req).field_0xbb >> 9 & 1) != 0) {
      *tep = "Transfer-Encoding: chunked\r\n";
    }
  }
  else {
    _Var2 = Curl_compareheader(headerline,"Transfer-Encoding:",0x12,"chunked",7);
    *(ushort *)&(data->req).field_0xbb =
         *(ushort *)&(data->req).field_0xbb & 0xfdff | (ushort)_Var2 << 9;
  }
  return ptr._4_4_;
}

Assistant:

CURLcode Curl_http_body(struct Curl_easy *data, struct connectdata *conn,
                        Curl_HttpReq httpreq, const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;
  struct HTTP *http = data->req.p.http;
  http->postsize = 0;

  switch(httpreq) {
  case HTTPREQ_POST_MIME:
    data->state.mimepost = &data->set.mimepost;
    break;
#ifndef CURL_DISABLE_FORM_API
  case HTTPREQ_POST_FORM:
    /* Convert the form structure into a mime structure, then keep
       the conversion */
    if(!data->state.formp) {
      data->state.formp = calloc(1, sizeof(curl_mimepart));
      if(!data->state.formp)
        return CURLE_OUT_OF_MEMORY;
      Curl_mime_cleanpart(data->state.formp);
      result = Curl_getformdata(data, data->state.formp, data->set.httppost,
                                data->state.fread_func);
      if(result) {
        Curl_safefree(data->state.formp);
        return result;
      }
      data->state.mimepost = data->state.formp;
    }
    break;
#endif
  default:
    data->state.mimepost = NULL;
  }

#ifndef CURL_DISABLE_MIME
  if(data->state.mimepost) {
    const char *cthdr = Curl_checkheaders(data, STRCONST("Content-Type"));

    /* Read and seek body only. */
    data->state.mimepost->flags |= MIME_BODY_ONLY;

    /* Prepare the mime structure headers & set content type. */

    if(cthdr)
      for(cthdr += 13; *cthdr == ' '; cthdr++)
        ;
    else if(data->state.mimepost->kind == MIMEKIND_MULTIPART)
      cthdr = "multipart/form-data";

    curl_mime_headers(data->state.mimepost, data->set.headers, 0);
    result = Curl_mime_prepare_headers(data, data->state.mimepost, cthdr,
                                       NULL, MIMESTRATEGY_FORM);
    curl_mime_headers(data->state.mimepost, NULL, 0);
    if(!result)
      result = Curl_mime_rewind(data->state.mimepost);
    if(result)
      return result;
    http->postsize = Curl_mime_size(data->state.mimepost);
  }
#endif

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
  }
  else {
    if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
       (((httpreq == HTTPREQ_POST_MIME || httpreq == HTTPREQ_POST_FORM) &&
         http->postsize < 0) ||
        ((data->state.upload || httpreq == HTTPREQ_POST) &&
         data->state.infilesize == -1))) {
      if(conn->bits.authneg)
        /* don't enable chunked during auth neg */
        ;
      else if(Curl_use_http_1_1plus(data, conn)) {
        if(conn->httpversion < 20)
          /* HTTP, upload, unknown file size and not HTTP 1.0 */
          data->req.upload_chunky = TRUE;
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}